

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

void __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
::clear(InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
        *this)

{
  ulong uVar1;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  if ((uVar1 & 1) == 0) {
    if (1 < uVar1) {
      memset(&this->rep_,0xab,(long)this + ((uVar1 >> 1) * 0x18 - (long)&this->rep_) + 8);
    }
  }
  else {
    if (1 < uVar1) {
      memset(*(void **)((long)&this->rep_ + 8),0xab,(uVar1 >> 1) * 0x18);
    }
    operator_delete(*(void **)((long)&this->rep_ + 8));
  }
  (this->allocator_and_tag_).tag_.size_ = 0;
  return;
}

Assistant:

void clear() noexcept {
    size_type s = size();
    if (allocated()) {
      Destroy(allocated_space(), allocated_space() + s);
      allocation().Dealloc(allocator());
    } else if (s != 0) {  // do nothing for empty vectors
      Destroy(inlined_space(), inlined_space() + s);
    }
    tag() = Tag();
  }